

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::PipelineRegressor::SerializeWithCachedSizes
          (PipelineRegressor *this,CodedOutputStream *output)

{
  if (this->pipeline_ != (Pipeline *)0x0 &&
      this != (PipelineRegressor *)&_PipelineRegressor_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (1,&this->pipeline_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void PipelineRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.PipelineRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pipeline pipeline = 1;
  if (this->has_pipeline()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, *this->pipeline_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.PipelineRegressor)
}